

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall miniros::Publication::drop(Publication *this)

{
  scoped_lock<std::mutex> *in_RDI;
  bool bVar1;
  Publication *in_stack_00000010;
  scoped_lock<std::mutex> lock2;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::scoped_lock<std::mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffc8);
  std::scoped_lock<std::mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = ((ulong)in_RDI[0x27]._M_device & 1) == 0;
  if (bVar1) {
    *(undefined1 *)&in_RDI[0x27]._M_device = 1;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x48870c);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x488716);
  if (bVar1) {
    dropAllConnections(in_stack_00000010);
  }
  return;
}

Assistant:

void Publication::drop()
{
  // grab a lock here, to ensure that no subscription callback will
  // be invoked after we return
  {
    std::scoped_lock<std::mutex> lock(publish_queue_mutex_);
    std::scoped_lock<std::mutex> lock2(subscriber_links_mutex_);

    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  dropAllConnections();
}